

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::FixIndentation::setIndents
          (FixIndentation *this,Fodder *fodder,uint all_but_last_indent,uint last_indent)

{
  pointer pFVar1;
  pointer pFVar2;
  uint uVar3;
  FodderElement *f;
  pointer pFVar4;
  uint uVar5;
  uint uVar6;
  
  pFVar1 = (fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  pFVar2 = (fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (pFVar4 = pFVar2; pFVar4 != pFVar1; pFVar4 = pFVar4 + 1) {
    uVar3 = uVar3 + (pFVar4->kind != INTERSTITIAL);
  }
  if (pFVar2 != pFVar1) {
    uVar5 = 0;
    do {
      if (pFVar2->kind != INTERSTITIAL) {
        uVar6 = all_but_last_indent;
        if ((uVar3 <= uVar5 + 1) && (uVar6 = last_indent, uVar5 != uVar3 - 1)) {
          __assert_fail("i == count - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                        ,0x593,
                        "void jsonnet::internal::FixIndentation::setIndents(Fodder &, unsigned int, unsigned int)"
                       );
        }
        pFVar2->indent = uVar6;
        uVar5 = uVar5 + 1;
      }
      pFVar2 = pFVar2 + 1;
    } while (pFVar2 != pFVar1);
  }
  return;
}

Assistant:

void setIndents(Fodder &fodder, unsigned all_but_last_indent, unsigned last_indent)
    {
        // First count how many there are.
        unsigned count = 0;
        for (const auto &f : fodder) {
            if (f.kind != FodderElement::INTERSTITIAL)
                count++;
        }
        // Now set the indents.
        unsigned i = 0;
        for (auto &f : fodder) {
            if (f.kind != FodderElement::INTERSTITIAL) {
                if (i + 1 < count) {
                    f.indent = all_but_last_indent;
                } else {
                    assert(i == count - 1);
                    f.indent = last_indent;
                }
                i++;
            }
        }
    }